

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_qrdmlah_s32_aarch64(void *vd,void *vn,void *vm,void *ve,uint32_t desc)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = desc * 8 & 0xff;
  uVar1 = (ulong)(uVar3 + 8);
  uVar4 = 0;
  do {
    lVar5 = (long)*(int *)((long)vd + uVar4) * 0x80000000 +
            (long)*(int *)((long)vm + uVar4) * (long)*(int *)((long)vn + uVar4) + 0x40000000;
    uVar6 = lVar5 >> 0x1f;
    if ((long)(int)uVar6 != uVar6) {
      *(undefined4 *)((long)ve + 0x2e50) = 1;
      uVar6 = lVar5 >> 0x3f ^ 0x7fffffff;
    }
    *(int *)((long)vd + uVar4) = (int)uVar6;
    uVar4 = uVar4 + 4;
  } while (uVar1 != uVar4);
  uVar2 = desc >> 2 & 0xf8;
  if (uVar3 < uVar2) {
    uVar6 = (ulong)(uVar2 + 8);
    uVar4 = uVar1 + 8;
    if (uVar1 + 8 < uVar6) {
      uVar4 = uVar6;
    }
    memset((void *)((long)vd + uVar1),0,(~uVar1 + uVar4 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_qrdmlah_s32)(void *vd, void *vn, void *vm,
                              void *ve, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    int32_t *d = vd;
    int32_t *n = vn;
    int32_t *m = vm;
    CPUARMState *env = ve;
    uintptr_t i;

    for (i = 0; i < opr_sz / 4; ++i) {
        d[i] = helper_neon_qrdmlah_s32(env, n[i], m[i], d[i]);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}